

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

nn_optset * nn_ws_optset(void)

{
  nn_optset *pnVar1;
  nn_ws_optset *optset;
  
  pnVar1 = (nn_optset *)nn_alloc_(0x10);
  if (pnVar1 == (nn_optset *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws.c"
            ,100);
    fflush(_stderr);
    nn_err_abort();
  }
  pnVar1->vfptr = &nn_ws_optset_vfptr;
  *(undefined4 *)&pnVar1[1].vfptr = 2;
  return pnVar1;
}

Assistant:

static struct nn_optset *nn_ws_optset ()
{
    struct nn_ws_optset *optset;

    optset = nn_alloc (sizeof (struct nn_ws_optset), "optset (ws)");
    alloc_assert (optset);
    optset->base.vfptr = &nn_ws_optset_vfptr;

    /*  Default values for WebSocket options. */
    optset->msg_type = NN_WS_MSG_TYPE_BINARY;

    return &optset->base;   
}